

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdef.c
# Opt level: O0

s3pid_t mdef_phone_id_nearest(mdef_t *m,s3cipid_t b,s3cipid_t l,s3cipid_t r,word_posn_t pos)

{
  short lc;
  short rc;
  s3pid_t sVar1;
  char *wpos_name;
  s3cipid_t newr;
  s3cipid_t newl;
  s3pid_t p;
  word_posn_t tmppos;
  word_posn_t pos_local;
  s3cipid_t r_local;
  s3cipid_t l_local;
  s3cipid_t b_local;
  mdef_t *m_local;
  
  if (m == (mdef_t *)0x0) {
    __assert_fail("m",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                  ,0x14d,
                  "s3pid_t mdef_phone_id_nearest(mdef_t *, s3cipid_t, s3cipid_t, s3cipid_t, word_posn_t)"
                 );
  }
  if ((b < 0) || (m->n_ciphone <= (int)b)) {
    __assert_fail("(b >= 0) && (b < m->n_ciphone)",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                  ,0x14e,
                  "s3pid_t mdef_phone_id_nearest(mdef_t *, s3cipid_t, s3cipid_t, s3cipid_t, word_posn_t)"
                 );
  }
  if (WORD_POSN_SINGLE < pos) {
    __assert_fail("(pos >= 0) && (pos < N_WORD_POSN)",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                  ,0x14f,
                  "s3pid_t mdef_phone_id_nearest(mdef_t *, s3cipid_t, s3cipid_t, s3cipid_t, word_posn_t)"
                 );
  }
  if ((l < 0) || (r < 0)) {
    m_local._4_4_ = (int)b;
  }
  else {
    if ((l < 0) || (m->n_ciphone <= (int)l)) {
      __assert_fail("(l >= 0) && (l < m->n_ciphone)",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                    ,0x154,
                    "s3pid_t mdef_phone_id_nearest(mdef_t *, s3cipid_t, s3cipid_t, s3cipid_t, word_posn_t)"
                   );
    }
    if ((r < 0) || (m->n_ciphone <= (int)r)) {
      __assert_fail("(r >= 0) && (r < m->n_ciphone)",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                    ,0x155,
                    "s3pid_t mdef_phone_id_nearest(mdef_t *, s3cipid_t, s3cipid_t, s3cipid_t, word_posn_t)"
                   );
    }
    m_local._4_4_ = mdef_phone_id(m,b,l,r,pos);
    if (m_local._4_4_ < 0) {
      for (_newr = WORD_POSN_INTERNAL; _newr < WORD_POSN_UNDEFINED; _newr = _newr + WORD_POSN_BEGIN)
      {
        if ((_newr != pos) && (sVar1 = mdef_phone_id(m,b,l,r,_newr), -1 < sVar1)) {
          return sVar1;
        }
      }
      if (-1 < m->sil) {
        lc = l;
        if (m->ciphone[(int)l].filler != 0) {
          lc = m->sil;
        }
        rc = r;
        if (m->ciphone[(int)r].filler != 0) {
          rc = m->sil;
        }
        if ((lc != l) || (rc != r)) {
          sVar1 = mdef_phone_id(m,b,lc,rc,pos);
          if (-1 < sVar1) {
            return sVar1;
          }
          for (_newr = WORD_POSN_INTERNAL; _newr < WORD_POSN_UNDEFINED;
              _newr = _newr + WORD_POSN_BEGIN) {
            if ((_newr != pos) && (sVar1 = mdef_phone_id(m,b,lc,rc,_newr), -1 < sVar1)) {
              return sVar1;
            }
          }
        }
      }
      m_local._4_4_ = (int)b;
    }
  }
  return m_local._4_4_;
}

Assistant:

s3pid_t
mdef_phone_id_nearest(mdef_t * m,
                      s3cipid_t b, s3cipid_t l, s3cipid_t r,
                      word_posn_t pos)
{
    word_posn_t tmppos;
    s3pid_t p;
    s3cipid_t newl, newr;
    char *wpos_name;

    assert(m);
    assert((b >= 0) && (b < m->n_ciphone));
    assert((pos >= 0) && (pos < N_WORD_POSN));

    if ((NOT_S3CIPID(l)) || (NOT_S3CIPID(r)))
        return ((s3pid_t) b);

    assert((l >= 0) && (l < m->n_ciphone));
    assert((r >= 0) && (r < m->n_ciphone));

    p = mdef_phone_id(m, b, l, r, pos);
    if (IS_S3PID(p))
        return p;

    /* Exact triphone not found; backoff to other word positions */
    for (tmppos = 0; tmppos < N_WORD_POSN; tmppos++) {
        if (tmppos != pos) {
            p = mdef_phone_id(m, b, l, r, tmppos);
            if (IS_S3PID(p))
                return p;
        }
    }

    /* Nothing yet; backoff to silence phone if non-silence filler context */
    if (IS_S3CIPID(m->sil)) {
        newl = m->ciphone[(int) l].filler ? m->sil : l;
        newr = m->ciphone[(int) r].filler ? m->sil : r;
        if ((newl != l) || (newr != r)) {
            p = mdef_phone_id(m, b, newl, newr, pos);
            if (IS_S3PID(p))
                return p;

            for (tmppos = 0; tmppos < N_WORD_POSN; tmppos++) {
                if (tmppos != pos) {
                    p = mdef_phone_id(m, b, newl, newr, tmppos);
                    if (IS_S3PID(p))
                        return p;
                }
            }
        }
    }

    /* Nothing yet; backoff to base phone */
    if ((m->n_phone > m->n_ciphone) && (!m->ciphone[(int) b].filler)) {
        wpos_name = WPOS_NAME;
#if 0
        E_WARN("Triphone(%s,%s,%s,%c) not found; backing off to CIphone\n",
               mdef_ciphone_str(m, b),
               mdef_ciphone_str(m, l),
               mdef_ciphone_str(m, r), wpos_name[pos]);
#endif
    }
    return ((s3pid_t) b);
}